

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O2

void on_device_twin_update_received_callback
               (DEVICE_TWIN_UPDATE_TYPE update_type,uchar *message,size_t length,void *context)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  AMQP_TRANSPORT_DEVICE_INSTANCE *registered_device;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                 ,"on_device_twin_update_received_callback",0x21f,1,
                 "Invalid argument (context is NULL)");
      return;
    }
  }
  else {
    (**(code **)(*(long *)((long)context + 0x10) + 200))
              (update_type != DEVICE_TWIN_UPDATE_TYPE_COMPLETE,message,length,
               *(undefined8 *)(*(long *)((long)context + 0x10) + 0xe0));
    *(undefined8 *)((long)context + 0x28) = 0;
  }
  return;
}

Assistant:

static void on_device_twin_update_received_callback(DEVICE_TWIN_UPDATE_TYPE update_type, const unsigned char* message, size_t length, void* context)
{
    if (context == NULL)
    {
        LogError("Invalid argument (context is NULL)");
    }
    else
    {
        AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)context;

        registered_device->transport_instance->transport_callbacks.twin_retrieve_prop_complete_cb((update_type == DEVICE_TWIN_UPDATE_TYPE_COMPLETE ? DEVICE_TWIN_UPDATE_COMPLETE : DEVICE_TWIN_UPDATE_PARTIAL),
                message, length, registered_device->transport_instance->transport_ctx);

        registered_device->number_of_previous_failures = 0;
    }
}